

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOcontroller.h
# Opt level: O0

void IOcontroller::save_graph_struct(string *graphName,Graph *vecGraph,bool isReverse)

{
  string local_98;
  undefined1 local_78 [8];
  string filename;
  allocator local_41;
  undefined1 local_40 [8];
  string postfix;
  bool isReverse_local;
  Graph *vecGraph_local;
  string *graphName_local;
  
  postfix.field_2._M_local_buf[0xf] = isReverse;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,".vec.graph",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if ((postfix.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::__cxx11::string::operator=((string *)local_40,".vec.rvs.graph");
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 graphName,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::__cxx11::string::string((string *)&local_98,(string *)local_78);
  save_file<std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>>
            (&local_98,vecGraph);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

static void save_graph_struct(const std::string graphName, const Graph& vecGraph, const bool isReverse)
    {
        std::string postfix = ".vec.graph";
        if (isReverse) postfix = ".vec.rvs.graph";
        const std::string filename = graphName + postfix;
        save_file(filename, vecGraph);
    }